

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCache.c
# Opt level: O2

void If_ManCacheRecord(If_Man_t *p,int iDsd0,int iDsd1,int nShared,int iDsd)

{
  Vec_Int_t *p_00;
  int Entry;
  
  if ((-1 < nShared) && (nShared <= p->pPars->nLutSize)) {
    p_00 = p->vCutData;
    if (p_00 == (Vec_Int_t *)0x0) {
      p_00 = Vec_IntAlloc(10000);
      p->vCutData = p_00;
    }
    Entry = iDsd1;
    if (iDsd1 < iDsd0) {
      Entry = iDsd0;
    }
    if (iDsd0 < iDsd1) {
      iDsd1 = iDsd0;
    }
    Vec_IntPush(p_00,iDsd1);
    Vec_IntPush(p->vCutData,Entry);
    Vec_IntPush(p->vCutData,nShared);
    Vec_IntPush(p->vCutData,iDsd);
    return;
  }
  __assert_fail("nShared >= 0 && nShared <= p->pPars->nLutSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCache.c"
                ,0x2f,"void If_ManCacheRecord(If_Man_t *, int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void If_ManCacheRecord( If_Man_t * p, int iDsd0, int iDsd1, int nShared, int iDsd )
{
    assert( nShared >= 0 && nShared <= p->pPars->nLutSize );
    if ( p->vCutData == NULL )
        p->vCutData = Vec_IntAlloc( 10000 );
    if ( iDsd0 > iDsd1 )
        ABC_SWAP( int, iDsd0, iDsd1 );
    Vec_IntPush( p->vCutData, iDsd0 );
    Vec_IntPush( p->vCutData, iDsd1 );
    Vec_IntPush( p->vCutData, nShared );
    Vec_IntPush( p->vCutData, iDsd );
//    printf( "%6d %6d %6d %6d\n", iDsd0, iDsd1, nShared, iDsd );
}